

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.h
# Opt level: O0

bool tinyxml2::XMLUtil::StringEqual(char *p,char *q,int nChar)

{
  int iVar1;
  int nChar_local;
  char *q_local;
  char *p_local;
  
  if (p == q) {
    p_local._7_1_ = true;
  }
  else {
    iVar1 = strncmp(p,q,(long)nChar);
    p_local._7_1_ = iVar1 == 0;
  }
  return p_local._7_1_;
}

Assistant:

inline static bool StringEqual( const char* p, const char* q, int nChar=INT_MAX )  {
        if ( p == q ) {
            return true;
        }
        TIXMLASSERT( p );
        TIXMLASSERT( q );
        TIXMLASSERT( nChar >= 0 );
        return strncmp( p, q, nChar ) == 0;
    }